

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v11::basic_memory_buffer<wchar_t,_500UL,_fmt::v11::detail::allocator<wchar_t>_>::grow
               (buffer<wchar_t> *buf,size_t size)

{
  allocator<wchar_t> *b;
  allocator<wchar_t> *this;
  allocator<wchar_t> *paVar1;
  allocator<wchar_t> *n;
  buffer<wchar_t> *pbVar2;
  wchar_t *buf_data;
  size_t sVar3;
  allocator<wchar_t> *in_RSI;
  buffer<wchar_t> *in_RDI;
  wchar_t *new_data;
  wchar_t *old_data;
  size_t new_capacity;
  size_t old_capacity;
  size_t max_size;
  basic_memory_buffer<wchar_t,_500UL,_fmt::v11::detail::allocator<wchar_t>_> *self;
  wchar_t *p;
  allocator<wchar_t> *in_stack_ffffffffffffffb0;
  buffer<wchar_t> *this_00;
  
  v11::detail::abort_fuzzing_if(false);
  b = (allocator<wchar_t> *)
      std::allocator_traits<fmt::v11::detail::allocator<wchar_t>_>::max_size
                (in_stack_ffffffffffffffb0);
  this = (allocator<wchar_t> *)v11::detail::buffer<wchar_t>::capacity(in_RDI);
  paVar1 = this + ((ulong)this >> 1);
  n = in_RSI;
  if ((in_RSI <= paVar1) && (n = paVar1, b < paVar1)) {
    n = (allocator<wchar_t> *)max_of<unsigned_long>((unsigned_long)in_RSI,(unsigned_long)b);
  }
  pbVar2 = (buffer<wchar_t> *)v11::detail::buffer<wchar_t>::data(in_RDI);
  buf_data = v11::detail::allocator<wchar_t>::allocate(this,(size_t)n);
  v11::detail::buffer<wchar_t>::size(in_RDI);
  p = buf_data;
  this_00 = pbVar2;
  sVar3 = v11::detail::buffer<wchar_t>::size(in_RDI);
  memcpy(p,this_00,sVar3 << 2);
  v11::detail::buffer<wchar_t>::set(in_RDI,buf_data,(size_t)n);
  if (pbVar2 != in_RDI + 1) {
    v11::detail::allocator<wchar_t>::deallocate((allocator<wchar_t> *)this_00,p,0x701104);
  }
  return;
}

Assistant:

static FMT_CONSTEXPR20 void grow(detail::buffer<T>& buf, size_t size) {
    detail::abort_fuzzing_if(size > 5000);
    auto& self = static_cast<basic_memory_buffer&>(buf);
    const size_t max_size =
        std::allocator_traits<Allocator>::max_size(self.alloc_);
    size_t old_capacity = buf.capacity();
    size_t new_capacity = old_capacity + old_capacity / 2;
    if (size > new_capacity)
      new_capacity = size;
    else if (new_capacity > max_size)
      new_capacity = max_of(size, max_size);
    T* old_data = buf.data();
    T* new_data = self.alloc_.allocate(new_capacity);
    // Suppress a bogus -Wstringop-overflow in gcc 13.1 (#3481).
    detail::assume(buf.size() <= new_capacity);
    // The following code doesn't throw, so the raw pointer above doesn't leak.
    memcpy(new_data, old_data, buf.size() * sizeof(T));
    self.set(new_data, new_capacity);
    // deallocate must not throw according to the standard, but even if it does,
    // the buffer already uses the new storage and will deallocate it in
    // destructor.
    if (old_data != self.store_) self.alloc_.deallocate(old_data, old_capacity);
  }